

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::require_polyfill(CompilerGLSL *this,Polyfill polyfill,bool relaxed)

{
  Polyfill PVar1;
  long lVar2;
  undefined3 in_register_00000011;
  
  if ((CONCAT31(in_register_00000011,relaxed) == 0) || (lVar2 = 0x24b0, (this->options).es == false)
     ) {
    lVar2 = 0x24ac;
  }
  PVar1 = *(Polyfill *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar2 + -0x40);
  if ((PVar1 & polyfill) != 0) {
    return;
  }
  *(Polyfill *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar2 + -0x40) =
       PVar1 | polyfill;
  Compiler::force_recompile(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::require_polyfill(Polyfill polyfill, bool relaxed)
{
	uint32_t &polyfills = (relaxed && options.es) ? required_polyfills_relaxed : required_polyfills;

	if ((polyfills & polyfill) == 0)
	{
		polyfills |= polyfill;
		force_recompile();
	}
}